

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_shared_ptr.cpp
# Opt level: O3

void __thiscall Fixture::~Fixture(Fixture *this)

{
  int iVar1;
  
  if (this->state == (IObjectSharedState *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dtmoodie[P]RuntimeCompiledCPlusPlus/Aurora/tests/test_shared_ptr.cpp"
                  ,0x18,"Fixture::~Fixture()");
  }
  if (destroyed) {
    __assert_fail("!destroyed",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dtmoodie[P]RuntimeCompiledCPlusPlus/Aurora/tests/test_shared_ptr.cpp"
                  ,0x19,"Fixture::~Fixture()");
  }
  iVar1 = IObjectSharedState::StateCount(this->state);
  if (iVar1 != this->start_state_count) {
    __assert_fail("state->StateCount() == start_state_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dtmoodie[P]RuntimeCompiledCPlusPlus/Aurora/tests/test_shared_ptr.cpp"
                  ,0x1a,"Fixture::~Fixture()");
  }
  iVar1 = IObjectSharedState::ObjectCount(this->state);
  if (iVar1 == this->start_obj_count) {
    rcc::weak_ptr<TestSharedPtrObj>::~weak_ptr(&this->weak);
    rcc::shared_ptr<TestSharedPtrObj>::~shared_ptr(&this->ptr);
    return;
  }
  __assert_fail("state->ObjectCount() == start_obj_count",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dtmoodie[P]RuntimeCompiledCPlusPlus/Aurora/tests/test_shared_ptr.cpp"
                ,0x1b,"Fixture::~Fixture()");
}

Assistant:

~Fixture(){
        assert(state);
        assert(!destroyed);
        assert(state->StateCount() == start_state_count);
        assert(state->ObjectCount() == start_obj_count);
    }